

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_modifiers_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
EmplaceHint<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
::TestBody(EmplaceHint<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
           *this)

{
  anon_union_8_1_a8a14541_for_iterator_1 *this_00;
  iterator i;
  const_iterator cVar1;
  iterator i_00;
  const_iterator cVar2;
  bool bVar3;
  reference piVar4;
  char *pcVar5;
  AssertHelper local_608;
  Message local_600;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_1;
  const_iterator local_5b8;
  iterator local_588;
  AssertHelper local_558;
  Message local_550;
  undefined1 local_548 [8];
  AssertionResult gtest_ar;
  iterator local_528;
  const_iterator local_4f8;
  undefined1 auStack_4c8 [8];
  iterator it;
  TypeParam m;
  T val;
  EmplaceHint<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
  *this_local;
  
  m.
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ =
       hash_internal::Generator<int,_void>::operator()
                 ((Generator<int,_void> *)
                  ((long)&m.
                          super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                          .sets_._M_elems[0xf].set_.settings_.
                          super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                  + 0x1b));
  this_00 = &it.it_end_.field_1;
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_set
            ((parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
              *)this_00);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::end(&local_528,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
         *)this_00);
  i.inner_end_ = local_528.inner_end_;
  i.inner_ = local_528.inner_;
  i.it_.ctrl_ = local_528.it_.ctrl_;
  i.it_.field_1.slot_ = local_528.it_.field_1.slot_;
  i.it_end_.ctrl_ = local_528.it_end_.ctrl_;
  i.it_end_.field_1.slot_ = local_528.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::const_iterator::const_iterator(&local_4f8,i);
  cVar1.iter_.inner_end_ = local_4f8.iter_.inner_end_;
  cVar1.iter_.inner_ = local_4f8.iter_.inner_;
  cVar1.iter_.it_.ctrl_ = local_4f8.iter_.it_.ctrl_;
  cVar1.iter_.it_.field_1.slot_ = local_4f8.iter_.it_.field_1.slot_;
  cVar1.iter_.it_end_.ctrl_ = local_4f8.iter_.it_end_.ctrl_;
  cVar1.iter_.it_end_.field_1.slot_ = local_4f8.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::emplace_hint<int&>
            ((iterator *)auStack_4c8,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&it.it_end_.field_1,cVar1,
             (int *)((long)&m.
                            super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                            .sets_._M_elems[0xf].set_.settings_.
                            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    + 0x1c));
  piVar4 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
           ::iterator::operator*((iterator *)auStack_4c8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_548,"val","*it",
             (int *)((long)&m.
                            super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                            .sets_._M_elems[0xf].set_.settings_.
                            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    + 0x1c),piVar4);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar3) {
    testing::Message::Message(&local_550);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x61,pcVar5);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_4c8;
  i_00.inner_end_ = it.inner_;
  i_00.inner_ = (Inner *)auStack_4c8;
  i_00.it_.ctrl_ = (ctrl_t *)it.inner_end_;
  i_00.it_.field_1.slot_ = (slot_type *)it.it_.ctrl_;
  i_00.it_end_.ctrl_ = (ctrl_t *)it.it_.field_1.slot_;
  i_00.it_end_.field_1.slot_ = (slot_type *)it.it_end_.ctrl_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::const_iterator::const_iterator(&local_5b8,i_00);
  cVar2.iter_.inner_end_ = local_5b8.iter_.inner_end_;
  cVar2.iter_.inner_ = local_5b8.iter_.inner_;
  cVar2.iter_.it_.ctrl_ = local_5b8.iter_.it_.ctrl_;
  cVar2.iter_.it_.field_1.slot_ = local_5b8.iter_.it_.field_1.slot_;
  cVar2.iter_.it_end_.ctrl_ = local_5b8.iter_.it_end_.ctrl_;
  cVar2.iter_.it_end_.field_1.slot_ = local_5b8.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::emplace_hint<int&>
            (&local_588,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&it.it_end_.field_1,cVar2,
             (int *)((long)&m.
                            super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                            .sets_._M_elems[0xf].set_.settings_.
                            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    + 0x1c));
  it.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_588.it_end_.ctrl_;
  it.it_end_.ctrl_ = (ctrl_t *)local_588.it_end_.field_1.slot_;
  it.inner_end_ = (Inner *)local_588.it_.ctrl_;
  it.it_.ctrl_ = (ctrl_t *)local_588.it_.field_1.slot_;
  auStack_4c8 = (undefined1  [8])local_588.inner_;
  it.inner_ = local_588.inner_end_;
  piVar4 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
           ::iterator::operator*((iterator *)auStack_4c8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_5f8,"val","*it",
             (int *)((long)&m.
                            super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                            .sets_._M_elems[0xf].set_.settings_.
                            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    + 0x1c),piVar4);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar3) {
    testing::Message::Message(&local_600);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_set
            ((parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
              *)&it.it_end_.field_1);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, EmplaceHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto it = m.emplace_hint(m.end(), val);
  EXPECT_EQ(val, *it);
  it = m.emplace_hint(it, val);
  EXPECT_EQ(val, *it);
}